

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O3

void insert_embryo_category
               (embryonic_ui_entry *embryo,char *name,wchar_t psource_index,wchar_t priority,
               _Bool priority_set,wchar_t ind)

{
  wchar_t *pwVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  char **ppcVar5;
  int iVar6;
  char **__dest;
  char *pcVar7;
  category_reference *pcVar8;
  ui_entry *puVar9;
  embryonic_category_reference *peVar10;
  long lVar11;
  wchar_t wVar12;
  long lVar13;
  wchar_t wVar14;
  wchar_t wVar15;
  long lVar16;
  ulong uVar17;
  
  __dest = categories;
  wVar12 = n_category;
  lVar16 = (long)n_category;
  if (lVar16 == 0) {
    uVar17 = 0;
    wVar14 = L'\0';
    if (nalloc_category != L'\0') {
LAB_001e3c57:
      lVar11 = (long)wVar14;
      goto LAB_001e3c5e;
    }
    nalloc_category = L'\b';
  }
  else {
    wVar15 = L'\0';
    uVar17 = (ulong)(uint)n_category;
    do {
      wVar14 = ((int)uVar17 + wVar15) / 2;
      iVar6 = strcmp(__dest[wVar14],name);
      ppcVar5 = categories;
      if (iVar6 == 0) goto LAB_001e3d0e;
      if (iVar6 < 0) {
        wVar15 = wVar14 + L'\x01';
      }
      else {
        uVar17 = (ulong)(uint)wVar14;
      }
      wVar14 = (wchar_t)uVar17;
    } while (wVar15 != wVar14);
    if (wVar12 != nalloc_category) {
      if (wVar12 <= wVar14) goto LAB_001e3c57;
      lVar11 = (long)wVar14;
      do {
        ppcVar5[lVar16] = ppcVar5[lVar16 + -1];
        lVar16 = lVar16 + -1;
      } while (lVar11 < lVar16);
LAB_001e3c5e:
      pcVar7 = string_make(name);
      __dest = categories;
      categories[lVar11] = pcVar7;
      goto LAB_001e3d05;
    }
    if (L'\x3fffffff' < wVar12) {
      quit("Too many categories");
      wVar12 = nalloc_category;
    }
    nalloc_category = L'\b';
    if (wVar12 != L'\0') {
      nalloc_category = wVar12 * 2;
    }
  }
  __dest = (char **)mem_alloc((long)nalloc_category << 3);
  wVar14 = (wchar_t)uVar17;
  if (L'\0' < wVar14) {
    memcpy(__dest,categories,uVar17 << 3);
  }
  pcVar7 = string_make(name);
  __dest[wVar14] = pcVar7;
  ppcVar5 = categories;
  if (n_category - wVar14 != 0 && wVar14 <= n_category) {
    memcpy(__dest + (long)wVar14 + 1,categories + wVar14,(long)(n_category - wVar14) << 3);
  }
  mem_free(ppcVar5);
  categories = __dest;
LAB_001e3d05:
  n_category = n_category + L'\x01';
LAB_001e3d0e:
  puVar9 = embryo->entry;
  wVar12 = puVar9->n_category;
  if (wVar12 == puVar9->nalloc_category) {
    if (L'\x3fffffff' < wVar12) {
      quit("Too many categories for an ui_entry");
      puVar9 = embryo->entry;
      wVar12 = puVar9->nalloc_category;
    }
    wVar15 = L'\x04';
    if (wVar12 != L'\0') {
      wVar15 = wVar12 * 2;
    }
    puVar9->nalloc_category = wVar15;
    if (embryo->exists == true) {
      pcVar8 = (category_reference *)mem_alloc((long)wVar15 << 4);
      if (L'\0' < ind) {
        memcpy(pcVar8,embryo->entry->categories,(ulong)(uint)ind << 4);
      }
      pcVar8[ind].name = categories[wVar14];
      pcVar8[ind].priority = priority;
      pcVar8[ind].priority_set = priority_set;
      puVar9 = embryo->entry;
      iVar6 = puVar9->n_category - ind;
      if (iVar6 != 0 && ind <= puVar9->n_category) {
        memcpy(pcVar8 + (long)ind + 1,puVar9->categories + ind,(long)iVar6 << 4);
        puVar9 = embryo->entry;
      }
      mem_free(puVar9->categories);
      embryo->entry->categories = pcVar8;
    }
    else {
      peVar10 = (embryonic_category_reference *)mem_alloc((long)wVar15 * 0x18);
      if (L'\0' < ind) {
        memcpy(peVar10,embryo->categories,(ulong)(uint)ind * 0x18);
      }
      peVar10[ind].name = categories[wVar14];
      peVar10[ind].psource_index = psource_index;
      peVar10[ind].priority = priority;
      peVar10[ind].priority_set = priority_set;
      wVar12 = embryo->entry->n_category;
      iVar6 = wVar12 - ind;
      if (iVar6 != 0 && ind <= wVar12) {
        memcpy(peVar10 + (long)ind + 1,embryo->categories + ind,(long)iVar6 * 0x18);
      }
      mem_free(embryo->categories);
      embryo->categories = peVar10;
    }
  }
  else {
    lVar16 = (long)wVar12;
    if (embryo->exists == false) {
      lVar11 = (long)ind;
      if (ind < wVar12) {
        lVar13 = lVar16 * 0x18;
        do {
          peVar10 = embryo->categories;
          *(undefined8 *)(&peVar10->priority_set + lVar13) =
               *(undefined8 *)((long)peVar10 + lVar13 + -8);
          puVar3 = (undefined8 *)((long)&peVar10[-1].name + lVar13);
          uVar4 = puVar3[1];
          puVar2 = (undefined8 *)((long)&peVar10->name + lVar13);
          *puVar2 = *puVar3;
          puVar2[1] = uVar4;
          lVar16 = lVar16 + -1;
          lVar13 = lVar13 + -0x18;
        } while (lVar11 < lVar16);
      }
      peVar10 = embryo->categories;
      peVar10[lVar11].name = __dest[wVar14];
      peVar10[lVar11].psource_index = psource_index;
      peVar10[lVar11].priority = priority;
      peVar10[lVar11].priority_set = priority_set;
    }
    else {
      if (ind < wVar12) {
        lVar11 = lVar16 << 4;
        do {
          pcVar8 = embryo->entry->categories;
          puVar3 = (undefined8 *)((long)&pcVar8[-1].name + lVar11);
          uVar4 = puVar3[1];
          puVar2 = (undefined8 *)((long)&pcVar8->name + lVar11);
          *puVar2 = *puVar3;
          puVar2[1] = uVar4;
          lVar16 = lVar16 + -1;
          lVar11 = lVar11 + -0x10;
        } while (ind < lVar16);
        puVar9 = embryo->entry;
      }
      pcVar8 = puVar9->categories;
      pcVar8[ind].name = __dest[wVar14];
      pcVar8[ind].priority = priority;
      pcVar8[ind].priority_set = priority_set;
    }
  }
  pwVar1 = &embryo->entry->n_category;
  *pwVar1 = *pwVar1 + L'\x01';
  return;
}

Assistant:

static void insert_embryo_category(struct embryonic_ui_entry *embryo,
	const char *name, int psource_index, int priority, bool priority_set,
	int ind)
{
	int cind;

	if (! search_categories(name, &cind)) {
		if (n_category == nalloc_category) {
			char **extended;

			if (n_category > INT_MAX / 2) {
				quit("Too many categories");
			}
			nalloc_category = (nalloc_category == 0) ?
				8 : nalloc_category * 2;
			extended = mem_alloc(nalloc_category *
				sizeof(*extended));
			if (cind > 0) {
				memcpy(extended, categories,
					cind * sizeof(*extended));
			}
			extended[cind] = string_make(name);
			if (cind < n_category) {
				memcpy(extended + cind + 1, categories + cind,
					(n_category - cind) *
					sizeof(*extended));
			}
			mem_free(categories);
			categories = extended;
		} else {
			int i;

			for (i = n_category; i > cind; --i) {
				categories[i] = categories[i - 1];
			}
			categories[cind] = string_make(name);
		}
		++n_category;
	}
	if (embryo->entry->n_category == embryo->entry->nalloc_category) {
		if (embryo->entry->nalloc_category > INT_MAX / 2) {
			quit("Too many categories for an ui_entry");
		}
		embryo->entry->nalloc_category =
			(embryo->entry->nalloc_category == 0) ?
			4 : 2 * embryo->entry->nalloc_category;
		if (embryo->exists) {
			struct category_reference *extended =
				mem_alloc(embryo->entry->nalloc_category *
				sizeof(*extended));

			if (ind > 0) {
				(void) memcpy(extended,
					embryo->entry->categories,
					ind * sizeof(*extended));
			}
			extended[ind].name = categories[cind];
			extended[ind].priority = priority;
			extended[ind].priority_set = priority_set;
			if (ind < embryo->entry->n_category) {
				(void) memcpy(extended + ind + 1,
					embryo->entry->categories + ind,
					(embryo->entry->n_category - ind) *
					sizeof(*extended));
			}
			mem_free(embryo->entry->categories);
			embryo->entry->categories = extended;
		} else {
			struct embryonic_category_reference *extended =
				mem_alloc(embryo->entry->nalloc_category *
				sizeof(*extended));

			if (ind > 0) {
				(void) memcpy(extended,
					embryo->categories,
					ind * sizeof(*extended));
			}
			extended[ind].name = categories[cind];
			extended[ind].psource_index = psource_index;
			extended[ind].priority = priority;
			extended[ind].priority_set = priority_set;
			if (ind < embryo->entry->n_category) {
				(void) memcpy(extended + ind + 1,
					embryo->categories + ind,
					(embryo->entry->n_category - ind) *
					sizeof(*extended));
			}
			mem_free(embryo->categories);
			embryo->categories = extended;
		}
	} else {
		int i;

		if (embryo->exists) {
			for (i = embryo->entry->n_category; i > ind; --i) {
				embryo->entry->categories[i] =
					embryo->entry->categories[i - 1];
			}
			embryo->entry->categories[ind].name = categories[cind];
			embryo->entry->categories[ind].priority = priority;
			embryo->entry->categories[ind].priority_set =
				priority_set;
		} else {
			for (i = embryo->entry->n_category; i > ind; --i) {
				embryo->categories[i] =
					embryo->categories[i - 1];
			}
			embryo->categories[ind].name = categories[cind];
			embryo->categories[ind].psource_index = psource_index;
			embryo->categories[ind].priority = priority;
			embryo->categories[ind].priority_set = priority_set;
		}
	}
	++embryo->entry->n_category;
}